

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

bool ExecuteWitnessScript
               (Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *stack_span,
               CScript *exec_script,uint flags,SigVersion sigversion,BaseSignatureChecker *checker,
               ScriptExecutionData *execdata,ScriptError *serror)

{
  pointer puVar1;
  uint uVar2;
  pointer puVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  ScriptError SVar7;
  pointer pvVar8;
  CScript *pCVar9;
  const_iterator end;
  ulong uVar10;
  ulong uVar11;
  byte unaff_R13B;
  long in_FS_OFFSET;
  opcodetype opcode;
  const_iterator pc;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  stack;
  opcodetype local_5c;
  const_iterator local_58;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>const*,void>
            ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&local_50,stack_span->m_data,stack_span->m_data + stack_span->m_size,
             (allocator_type *)&local_58);
  pvVar8 = local_50.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (sigversion == TAPSCRIPT) {
    local_58.ptr = (uchar *)exec_script;
    if (0x1c < (exec_script->super_CScriptBase)._size) {
      local_58.ptr = (uchar *)(exec_script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    do {
      uVar2 = (exec_script->super_CScriptBase)._size;
      uVar4 = uVar2 - 0x1d;
      if (uVar2 < 0x1d) {
        uVar4 = uVar2;
      }
      pCVar9 = (CScript *)(exec_script->super_CScriptBase)._union.indirect_contents.indirect;
      if (uVar2 < 0x1d) {
        pCVar9 = exec_script;
      }
      end.ptr = (uchar *)((long)&(pCVar9->super_CScriptBase)._union + (long)(int)uVar4);
      if (end.ptr <= local_58.ptr) {
        bVar5 = true;
        if (1000 < (ulong)(((long)local_50.
                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_50.
                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555)) {
          if (serror != (ScriptError *)0x0) {
            *serror = SCRIPT_ERR_STACK_SIZE;
          }
          bVar5 = false;
          unaff_R13B = 0;
        }
        goto LAB_001f12e7;
      }
      bVar5 = GetScriptOp(&local_58,end,&local_5c,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
      if (bVar5) {
        bVar6 = IsOpSuccess(&local_5c);
        bVar5 = true;
        if (bVar6) {
          if ((flags >> 0x13 & 1) != 0) {
            SVar7 = SCRIPT_ERR_DISCOURAGE_OP_SUCCESS;
            goto LAB_001f128c;
          }
          SVar7 = SCRIPT_ERR_OK;
          unaff_R13B = 1;
          if (serror != (ScriptError *)0x0) goto LAB_001f1299;
          goto LAB_001f129c;
        }
      }
      else {
        SVar7 = SCRIPT_ERR_BAD_OPCODE;
LAB_001f128c:
        unaff_R13B = 0;
        bVar5 = false;
        if (serror != (ScriptError *)0x0) {
LAB_001f1299:
          *serror = SVar7;
LAB_001f129c:
          bVar5 = false;
        }
      }
    } while (bVar5);
    bVar5 = false;
LAB_001f12e7:
    pvVar8 = local_50.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (!bVar5) goto LAB_001f13f3;
  }
  for (; pvVar8 != local_50.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pvVar8 = pvVar8 + 1) {
    uVar10 = (long)(pvVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
    if (serror == (ScriptError *)0x0 || uVar10 < 0x209) {
      unaff_R13B = unaff_R13B & uVar10 < 0x209;
    }
    else {
      *serror = SCRIPT_ERR_PUSH_SIZE;
      unaff_R13B = 0;
    }
    if (0x208 < uVar10) break;
  }
  if (pvVar8 == local_50.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    bVar5 = EvalScript(&local_50,exec_script,flags,checker,sigversion,execdata,serror);
    if (bVar5) {
      if ((long)local_50.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_50.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x18) {
        puVar3 = local_50.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = (long)local_50.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar3;
        bVar5 = uVar10 != 0;
        if (bVar5) {
          if (*puVar3 == '\0') {
            uVar11 = 1;
            do {
              bVar5 = uVar11 < uVar10;
              if (uVar10 <= uVar11) goto LAB_001f13d7;
              puVar1 = puVar3 + uVar11;
              uVar11 = (ulong)((int)uVar11 + 1);
            } while (*puVar1 == '\0');
          }
          uVar10 = 1;
        }
LAB_001f13d7:
        if ((bVar5) && (unaff_R13B = 1, (uVar10 & 1) != 0)) goto LAB_001f13f3;
        SVar7 = SCRIPT_ERR_EVAL_FALSE;
      }
      else {
        SVar7 = SCRIPT_ERR_CLEANSTACK;
      }
      if (serror != (ScriptError *)0x0) {
        *serror = SVar7;
      }
    }
    unaff_R13B = 0;
  }
LAB_001f13f3:
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(unaff_R13B & 1);
}

Assistant:

static bool ExecuteWitnessScript(const Span<const valtype>& stack_span, const CScript& exec_script, unsigned int flags, SigVersion sigversion, const BaseSignatureChecker& checker, ScriptExecutionData& execdata, ScriptError* serror)
{
    std::vector<valtype> stack{stack_span.begin(), stack_span.end()};

    if (sigversion == SigVersion::TAPSCRIPT) {
        // OP_SUCCESSx processing overrides everything, including stack element size limits
        CScript::const_iterator pc = exec_script.begin();
        while (pc < exec_script.end()) {
            opcodetype opcode;
            if (!exec_script.GetOp(pc, opcode)) {
                // Note how this condition would not be reached if an unknown OP_SUCCESSx was found
                return set_error(serror, SCRIPT_ERR_BAD_OPCODE);
            }
            // New opcodes will be listed here. May use a different sigversion to modify existing opcodes.
            if (IsOpSuccess(opcode)) {
                if (flags & SCRIPT_VERIFY_DISCOURAGE_OP_SUCCESS) {
                    return set_error(serror, SCRIPT_ERR_DISCOURAGE_OP_SUCCESS);
                }
                return set_success(serror);
            }
        }

        // Tapscript enforces initial stack size limits (altstack is empty here)
        if (stack.size() > MAX_STACK_SIZE) return set_error(serror, SCRIPT_ERR_STACK_SIZE);
    }

    // Disallow stack item size > MAX_SCRIPT_ELEMENT_SIZE in witness stack
    for (const valtype& elem : stack) {
        if (elem.size() > MAX_SCRIPT_ELEMENT_SIZE) return set_error(serror, SCRIPT_ERR_PUSH_SIZE);
    }

    // Run the script interpreter.
    if (!EvalScript(stack, exec_script, flags, checker, sigversion, execdata, serror)) return false;

    // Scripts inside witness implicitly require cleanstack behaviour
    if (stack.size() != 1) return set_error(serror, SCRIPT_ERR_CLEANSTACK);
    if (!CastToBool(stack.back())) return set_error(serror, SCRIPT_ERR_EVAL_FALSE);
    return true;
}